

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

time_t __thiscall Date::time(Date *this,time_t *__timer)

{
  tm *__tp;
  undefined1 local_58 [8];
  tm local;
  Mode mode_local;
  Date *this_local;
  
  local.tm_zone._4_4_ = (int)__timer;
  if (local.tm_zone._4_4_ == 1) {
    this_local = (Date *)this->mTime;
  }
  else {
    __tp = localtime_r(&this->mTime,(tm *)local_58);
    this_local = (Date *)mktime(__tp);
  }
  return (time_t)this_local;
}

Assistant:

time_t Date::time(Mode mode) const
{
    if (mode == UTC)
        return mTime;
#ifdef _WIN32
    return mktime(localtime(&mTime));
#else
    struct tm local;
    return mktime(localtime_r(&mTime, &local));
#endif
}